

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ostream * Kandinsky::operator<<(ostream *stream,Expression *expression)

{
  string local_30 [32];
  
  (*expression->_vptr_Expression[2])(local_30,expression,0);
  std::operator<<(stream,local_30);
  std::__cxx11::string::~string(local_30);
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const Expression& expression) {
        stream << expression.toString();
        return stream;
    }